

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void jmp_list_patch(Parser *psr,int head_idx,int target_idx)

{
  uint uVar1;
  BcIns *pBVar2;
  
  while( true ) {
    if (head_idx < 0) {
      return;
    }
    if ((psr->vm->fns[psr->scope->fn].ins[(uint)head_idx] >> 8) + head_idx == 0x7ffffe) break;
    pBVar2 = psr->vm->fns[psr->scope->fn].ins;
    uVar1 = pBVar2[(uint)head_idx];
    pBVar2[(uint)head_idx] = (target_idx - head_idx) * 0x100 + (uVar1 & 0xff) + 0x7fffff00;
    head_idx = (head_idx + (uVar1 >> 8)) - 0x7fffff;
  }
  pBVar2 = psr->vm->fns[psr->scope->fn].ins;
  pBVar2[(uint)head_idx] =
       (target_idx - head_idx) * 0x100 + (uint)(byte)pBVar2[(uint)head_idx] + 0x7fffff00;
  return;
}

Assistant:

static void jmp_list_patch(Parser *psr, int head_idx, int target_idx) {
	if (head_idx < 0) {
		// Don't do anything if the list is empty
	} else if (jmp_follow(psr, head_idx) == -1) {
		// We've reached the last element in the jump list
		jmp_set_target(psr, head_idx, target_idx);
	} else {
		// Preserve the next JMP in the list
		int next_idx = jmp_follow(psr, head_idx);
		jmp_set_target(psr, head_idx, target_idx);

		// Do the recursive call last so hopefully the compiler can do a tail
		// call optimisation
		jmp_list_patch(psr, next_idx, target_idx);
	}
}